

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char (*pacVar1) [10];
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  UBool UVar6;
  UBool UVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  int extraout_EAX;
  FILE *pFVar15;
  size_t sVar16;
  char *pcVar17;
  char *buffer;
  char *optEntryPoint;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  size_t sVar21;
  char *pcVar22;
  FileStream *pFVar23;
  size_t sVar24;
  size_t sVar25;
  undefined8 extraout_RAX;
  byte bVar26;
  int32_t i_1;
  char *installDir;
  UErrorCode *pUVar27;
  char *outComment;
  FILE *__stream;
  char *pcVar28;
  char *pcVar29;
  char **ppcVar30;
  char cVar31;
  char *__src;
  char *pcVar32;
  char *pcVar33;
  ulong uVar34;
  char *pcVar35;
  char cVar36;
  int32_t i;
  long lVar37;
  bool bVar38;
  bool bVar39;
  byte local_6302;
  CharList *local_6300;
  CharList *local_62f8;
  UBool local_62e4;
  CharList *local_62e0;
  char *local_62d8;
  CharList *local_62c8;
  char *local_62b8;
  char *local_62b0;
  char *local_62a8;
  CharList *local_62a0;
  CharList *local_6290;
  CharList *local_6280;
  char version_major [10];
  CharList *tail;
  char targetDir [512];
  UErrorCode status_1;
  uint local_6030;
  char newName [512];
  char gencFilePath [512];
  UErrorCode status;
  char dataName [512];
  CharString cmdBuf;
  char datFileName [512];
  char local_4c38 [512];
  char cmd [28];
  char tmpDir [512];
  char dirBuf [1024];
  
  progname = *argv;
  options[2].value = "common";
  uVar8 = u_parseArgs(argc,argv,0x16,options);
  if (options[4].doesOccur != '\0' || options[3].doesOccur != '\0') {
    main_cold_22();
    return 1;
  }
  if ((int)uVar8 < 0) {
    main_cold_21();
    return 1;
  }
  if ((options[1].doesOccur == '\0') &&
     (iVar9 = strcmp(options[2].value,"common"), cVar31 = options[5].doesOccur, iVar9 != 0)) {
    icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&cmdBuf.buffer);
    cmdBuf.len = 0;
    *cmdBuf.buffer.ptr = '\0';
    status = U_ZERO_ERROR;
    builtin_strncpy(cmd + 0x10,"pkgdatafile",0xc);
    builtin_strncpy(cmd,"icu-config --inc",0x10);
    memset(dirBuf,0,0x400);
    findDirname(progname,dirBuf,0x400,&status);
    bVar38 = true;
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::StringPiece::StringPiece((StringPiece *)&status_1,dirBuf);
      icu_63::CharString::append(&cmdBuf,_status_1,local_6030,&status);
      if (*cmdBuf.buffer.ptr != '\0') {
        icu_63::StringPiece::StringPiece((StringPiece *)newName,"/");
        icu_63::CharString::append
                  (&cmdBuf,(char *)CONCAT44(newName._4_4_,newName._0_4_),newName._8_4_,&status);
      }
      icu_63::StringPiece::StringPiece((StringPiece *)dataName,cmd);
      icu_63::CharString::append
                (&cmdBuf,(char *)CONCAT71(dataName._1_7_,dataName[0]),dataName._8_4_,&status);
      if (cVar31 != '\0') {
        fprintf(_stdout,"# Calling icu-config: %s\n",cmdBuf.buffer.ptr);
      }
      pFVar15 = popen(cmdBuf.buffer.ptr,"r");
      if (pFVar15 == (FILE *)0x0) goto LAB_001e7e28;
      sVar16 = fread(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf,1,0x1ff,pFVar15);
      if (sVar16 == 0) {
        bVar38 = false;
        __stream = pFVar15;
        goto LAB_001e7e2a;
      }
    }
    else {
LAB_001e7e28:
      __stream = (FILE *)0x0;
LAB_001e7e2a:
      if (cVar31 != '\0') {
        fprintf(_stdout,"# Calling icu-config: %s\n",cmd);
      }
      pFVar15 = popen(cmd,"r");
      if (!bVar38) {
        pclose(__stream);
      }
      if (pFVar15 == (FILE *)0x0) {
        fprintf(_stderr,"%s: icu-config: No icu-config found. (fix PATH or use -O option)\n",
                progname);
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
        goto LAB_001e9b80;
      }
      sVar16 = fread(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf,1,0x1ff,pFVar15);
      if (sVar16 == 0) {
        fprintf(_stderr,"%s: icu-config: No icu-config found. (fix PATH or use -O option)\n",
                progname);
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
        pclose(pFVar15);
        goto LAB_001e9b80;
      }
    }
    sVar16 = strlen(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
    uVar10 = (int)sVar16 - 1;
    if (-1 < (int)uVar10) {
      uVar34 = (ulong)uVar10;
      do {
        if (((&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar34] != ' ') &&
           ((&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar34] != '\n')) break;
        (&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar34] = 0;
        bVar38 = 0 < (long)uVar34;
        uVar34 = uVar34 - 1;
      } while (bVar38);
    }
    sVar16 = strlen(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
    if (libFileNames[3][sVar16 + 0xff] == '\n') {
      libFileNames[3][sVar16 + 0xff] = '\0';
    }
    cVar4 = pkg_getOptionsFromICUConfig(signed,UOption*)::buf;
    if (pkg_getOptionsFromICUConfig(signed,UOption*)::buf == '\0') {
      main_cold_1();
    }
    else {
      if (cVar31 != '\0') {
        fprintf(_stdout,"# icu-config said: %s\n",&pkg_getOptionsFromICUConfig(signed,UOption*)::buf
               );
      }
      options[1].value = &pkg_getOptionsFromICUConfig(signed,UOption*)::buf;
      options[1].doesOccur = '\x01';
    }
    icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
    pclose(pFVar15);
    if (cVar4 == '\0') {
LAB_001e9b80:
      main_cold_2();
      return 1;
    }
  }
  pcVar35 = options[0xe].value;
  pcVar22 = options[2].value;
  pcVar32 = options[0].value;
  if (options[0].doesOccur == '\0') {
    main_cold_20();
    return 1;
  }
  if (uVar8 == 1) {
    main_cold_19();
    return 1;
  }
  pcVar17 = (char *)0x0;
  if (options[0xe].doesOccur != '\0') {
    pcVar17 = options[0xe].value;
  }
  sVar16 = strlen(options[0].value);
  buffer = (char *)uprv_malloc_63((long)((int)sVar16 + 2));
  cVar31 = *pcVar32;
  pcVar33 = buffer;
  if (cVar31 != 0) {
    iVar9 = isalpha((int)cVar31);
    cVar4 = '_';
    if (iVar9 != 0) {
      cVar4 = cVar31;
    }
    *buffer = cVar4;
    pcVar33 = buffer + 1;
    cVar31 = pcVar32[1];
    if (cVar31 != '\0') {
      pcVar28 = pcVar32 + 2;
      do {
        iVar9 = isalnum((int)cVar31);
        cVar4 = '_';
        if (iVar9 != 0) {
          cVar4 = cVar31;
        }
        *pcVar33 = cVar4;
        pcVar33 = pcVar33 + 1;
        cVar31 = *pcVar28;
        pcVar28 = pcVar28 + 1;
      } while (cVar31 != '\0');
    }
  }
  *pcVar33 = '\0';
  pcVar33 = pcVar32;
  if (options[0x10].doesOccur != '\0') {
    pcVar33 = options[0x10].value;
  }
  if (options[0x13].doesOccur != '\0') {
    fwrite("Warning: You are using the -z option which only works on z/OS.\n",0x3f,1,_stdout);
  }
  cVar3 = options[0x12].doesOccur;
  cVar4 = options[9].doesOccur;
  cVar31 = options[5].doesOccur;
  local_62b0 = (char *)0x0;
  if (options[1].doesOccur != '\0') {
    local_62b0 = options[1].value;
  }
  pcVar28 = (char *)0x0;
  if (options[7].doesOccur != '\0') {
    pcVar28 = options[7].value;
  }
  outComment = 
  " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
  ;
  if (options[6].doesOccur == '\0') {
    outComment = pcVar28;
  }
  local_62a8 = ".";
  pcVar28 = ".";
  if (options[8].doesOccur != '\0') {
    pcVar28 = options[8].value;
  }
  local_62b8 = pcVar28;
  if (options[10].doesOccur != '\0') {
    local_62b8 = options[10].value;
  }
  installDir = (char *)0x0;
  if (options[0xb].doesOccur != '\0') {
    installDir = options[0xb].value;
  }
  if (options[0xc].doesOccur != '\0') {
    local_62a8 = options[0xc].value;
  }
  optEntryPoint = buffer;
  if (options[0xd].doesOccur != '\0') {
    optEntryPoint = options[0xd].value;
  }
  local_62d8 = (char *)CONCAT71(local_62d8._1_7_,options[0x12].doesOccur);
  tail = (CharList *)0x0;
  if ((int)uVar8 < 2) {
LAB_001e8488:
    local_62e0 = (CharList *)0x0;
    bVar38 = true;
    local_6300 = (CharList *)0x0;
    local_62c8 = (CharList *)0x0;
  }
  else {
    uVar34 = 1;
    local_62a0 = (CharList *)0x0;
    do {
      pcVar18 = uprv_strdup_63(argv[uVar34]);
      local_62a0 = pkg_appendToList(local_62a0,&tail,pcVar18);
      uVar34 = uVar34 + 1;
    } while (uVar8 != uVar34);
    cmdBuf.buffer.ptr = (char *)0x0;
    cmd[0] = '\0';
    cmd[1] = '\0';
    cmd[2] = '\0';
    cmd[3] = '\0';
    cmd[4] = '\0';
    cmd[5] = '\0';
    cmd[6] = '\0';
    cmd[7] = '\0';
    bVar38 = local_62a0 == (CharList *)0x0;
    if (bVar38) goto LAB_001e8488;
    local_6300 = (CharList *)0x0;
    local_62c8 = (CharList *)0x0;
    uVar8 = 0;
    local_62f8 = local_62a0;
    do {
      if (cVar31 != '\0') {
        fprintf(_stdout,"# pkgdata: Reading %s..\n",local_62f8->str);
      }
      local_62e0 = (CharList *)T_FileStream_open(local_62f8->str,"r");
      if (local_62e0 == (CharList *)0x0) {
        main_cold_7();
        return 2;
      }
      pcVar18 = T_FileStream_readLine((FileStream *)local_62e0,dirBuf,0x4000);
      while (pcVar18 != (char *)0x0) {
        uVar8 = uVar8 + 1;
        sVar16 = strlen(dirBuf);
        pcVar29 = tmpDir + 0x1ff;
        pcVar18 = dirBuf + 1;
        if (0x3fac < sVar16) {
          main_cold_6();
          icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
          _Unwind_Resume(extraout_RAX);
        }
        do {
          pcVar20 = pcVar18;
          cVar36 = pcVar29[1];
          pcVar29 = pcVar29 + 1;
          iVar9 = isspace((int)cVar36);
          pcVar18 = pcVar20 + 1;
          cVar5 = cVar36;
        } while (iVar9 != 0);
        while (cVar5 != '\0') {
          if ((cVar5 == '\r') || (cVar5 == '\n')) {
            pcVar20[-1] = '\0';
            cVar36 = *pcVar29;
            break;
          }
          cVar5 = *pcVar20;
          pcVar20 = pcVar20 + 1;
        }
        if ((cVar36 != '\0') && (cVar36 != '#')) {
          do {
            bVar26 = (byte)pcVar18;
            cVar36 = *pcVar29;
            if (cVar36 == '\0') break;
            pcVar29 = pcVar29 + 1;
            pcVar20 = pcVar29;
            while (cVar36 == ' ') {
              cVar36 = *pcVar20;
              pcVar20 = pcVar20 + 1;
            }
            if (cVar36 == '\"') {
              pcVar19 = strchr(pcVar20,0x22);
              if (pcVar19 != (char *)0x0) {
                pcVar29 = pcVar19 + 1;
                bVar26 = pcVar19[1];
                pcVar18 = (char *)(ulong)bVar26;
                if (bVar26 != 0) {
                  if (bVar26 != 0x20) goto LAB_001e9e16;
                  pcVar19[1] = '\0';
                  pcVar29 = pcVar19 + 2;
                }
                goto LAB_001e8346;
              }
LAB_001e9e09:
              main_cold_3();
LAB_001e9e16:
              fprintf(_stderr,
                      "%s:%d - malformed quoted line at position %d, expected \' \' got \'%c\'\n",
                      local_62f8->str,(ulong)uVar8,(ulong)(uint)((int)pcVar29 - (int)dirBuf),
                      (ulong)(uint)(int)(char)bVar26);
              exit(1);
            }
            pcVar29 = strchr(pcVar20 + -1,0x20);
            if (pcVar29 == (char *)0x0) {
              pcVar29 = (char *)0x0;
            }
            else {
              *pcVar29 = '\0';
              pcVar29 = pcVar29 + 1;
            }
LAB_001e8346:
            pcVar19 = getLongPathname(pcVar20 + -1);
            pcVar20 = uprv_strdup_63(pcVar20 + -1);
            local_6300 = pkg_appendToList(local_6300,(CharList **)&cmdBuf,pcVar20);
            UVar6 = uprv_pathIsAbsolute_63(pcVar19);
            if ((UVar6 != '\0') || (*pcVar19 == '.')) {
              main_cold_5();
              pcVar22 = local_62a8;
              iVar9 = extraout_EAX;
              goto LAB_001e9dd5;
            }
            sVar16 = strlen(local_62a8);
            sVar21 = strlen(pcVar19);
            pcVar20 = (char *)uprv_malloc_63((long)((int)sVar16 + (int)sVar21 + 5));
            bVar26 = (byte)pcVar18;
            if (pcVar20 == (char *)0x0) {
              main_cold_4();
              goto LAB_001e9e09;
            }
            strcpy(pcVar20,local_62a8);
            sVar16 = strlen(local_62a8);
            __src = "/";
            if (local_62a8[sVar16 - 1] == '/') {
              __src = "";
            }
            strcat(pcVar20,__src);
            strcat(pcVar20,pcVar19);
            local_62c8 = pkg_appendToList(local_62c8,(CharList **)cmd,pcVar20);
          } while (pcVar29 != (char *)0x0);
        }
        pcVar18 = T_FileStream_readLine((FileStream *)local_62e0,dirBuf,0x4000);
      }
      T_FileStream_close((FileStream *)local_62e0);
      local_62f8 = local_62f8->next;
      local_62e0 = local_62a0;
    } while (local_62f8 != (_CharList *)0x0);
  }
  bVar26 = *pcVar22;
  local_62f8 = (CharList *)(ulong)bVar26;
  memset(targetDir,0,0x200);
  memset(tmpDir,0,0x200);
  memset(datFileName,0,0x200);
  memset(&cmdBuf,0,0x800);
  memset(cmd,0,0x800);
  dirBuf[0] = '\0';
  dirBuf[1] = '\0';
  dirBuf[2] = '\0';
  dirBuf[3] = '\0';
  pkgDataFlags = (char **)uprv_malloc_63(0x88);
  if (pkgDataFlags != (char **)0x0) {
    iVar9 = 0x200;
    do {
      lVar37 = 0;
      do {
        pcVar22 = (char *)uprv_malloc_63((long)iVar9);
        ppcVar30 = pkgDataFlags;
        pkgDataFlags[lVar37] = pcVar22;
        if (pcVar22 == (char *)0x0) {
          main_cold_8();
          goto LAB_001e86a1;
        }
        *pcVar22 = '\0';
        lVar37 = lVar37 + 1;
      } while (lVar37 != 0x11);
      if (local_62b0 == (char *)0x0) goto LAB_001e86a1;
      if (cVar31 != '\0') {
        fprintf(_stdout,"# Reading options file %s\n",local_62b0);
        ppcVar30 = pkgDataFlags;
      }
      dirBuf[0] = '\0';
      dirBuf[1] = '\0';
      dirBuf[2] = '\0';
      dirBuf[3] = '\0';
      iVar11 = parseFlagsFile(local_62b0,ppcVar30,iVar9,FLAG_NAMES,0x11,(UErrorCode *)dirBuf);
      pFVar15 = _stderr;
      if (dirBuf._0_4_ == 0xf) {
        lVar37 = 0;
        ppcVar30 = pkgDataFlags;
        do {
          if (ppcVar30[lVar37] != (char *)0x0) {
            uprv_free_63(ppcVar30[lVar37]);
            ppcVar30 = pkgDataFlags;
            pkgDataFlags[lVar37] = (char *)0x0;
          }
          lVar37 = lVar37 + 1;
          iVar9 = iVar11;
        } while (lVar37 != 0x11);
      }
      else if (0 < (int)dirBuf._0_4_) {
        pcVar22 = u_errorName_63(dirBuf._0_4_);
        fprintf(pFVar15,"Unable to open or read \"%s\" option file. status = %s\n",local_62b0,
                pcVar22);
        goto LAB_001e86a1;
      }
      if (cVar31 != '\0') {
        fwrite("# pkgDataFlags=\n",0x10,1,_stdout);
        ppcVar30 = FLAG_NAMES;
        uVar34 = 0;
        do {
          fprintf(_stdout,"  [%d] %s:  %s\n",uVar34 & 0xffffffff,*ppcVar30);
          uVar34 = uVar34 + 1;
          ppcVar30 = ppcVar30 + 1;
        } while (uVar34 != 0x11);
        fputc(10,_stdout);
      }
      if (dirBuf._0_4_ != 0xf) goto LAB_001e86a1;
    } while (pkgDataFlags != (char **)0x0);
  }
  main_cold_9();
LAB_001e86a1:
  if (bVar26 == 0x66) {
    if (installDir == (char *)0x0) {
      iVar9 = 0;
    }
    else {
      strcpy(targetDir,installDir);
      sVar16 = strlen(targetDir);
      (targetDir + sVar16)[0] = '/';
      (targetDir + sVar16)[1] = '\0';
      strcat(targetDir,pcVar32);
      if (cVar31 != '\0') {
        fprintf(_stdout,"# Install: Files mode, copying files to %s..\n",targetDir);
      }
      pcVar32 = local_62e0->str;
      memset(dirBuf,0,0x200);
      UVar6 = T_FileStream_file_exists(targetDir);
      if (UVar6 == '\0') {
        _status_1 = (char *)((ulong)_status_1 & 0xffffffff00000000);
        uprv_mkdir(targetDir,&status_1);
        if (U_ZERO_ERROR < status_1) {
          fprintf(_stderr,"Error creating installation directory: %s\n",targetDir);
          iVar9 = -1;
          goto LAB_001e9a26;
        }
      }
      memset(&status_1,0,0x200);
      pFVar23 = T_FileStream_open(pcVar32,"r");
      if (pFVar23 == (FileStream *)0x0) {
        fprintf(_stderr,"Unable to open list file: %s\n",pcVar32);
        iVar9 = -1;
      }
      else {
        do {
          pcVar22 = T_FileStream_readLine(pFVar23,(char *)&status_1,0x200);
          if (pcVar22 == (char *)0x0) {
            iVar12 = T_FileStream_eof(pFVar23);
            iVar9 = 0;
            if (iVar12 == 0) {
              fprintf(_stderr,"Failed to read line from file: %s\n",pcVar32);
              iVar9 = -1;
            }
            goto LAB_001e8ae2;
          }
          sVar16 = strlen((char *)&status_1);
          if (0 < (int)sVar16) {
            *(undefined1 *)((long)&status_1 + (ulong)((int)sVar16 - 1)) = 0;
          }
          UVar6 = -0x70;
          sprintf(dirBuf,"%s %s%s%s %s%s%s",pkgDataFlags[0x10],local_62a8,"/",&status_1,targetDir,
                  "/",&status_1);
          iVar9 = runCommand(dirBuf,UVar6);
        } while (iVar9 == 0);
        fprintf(_stderr,"Failed to install data file with command: %s\n",dirBuf);
LAB_001e8ae2:
        T_FileStream_close(pFVar23);
      }
    }
    goto LAB_001e9a26;
  }
  strcpy(targetDir,pcVar28);
  sVar16 = strlen(targetDir);
  (targetDir + sVar16)[0] = '/';
  (targetDir + sVar16)[1] = '\0';
  strcpy(tmpDir,local_62b8);
  sVar16 = strlen(tmpDir);
  (tmpDir + sVar16)[0] = '/';
  (tmpDir + sVar16)[1] = '\0';
  strcpy((char *)&cmdBuf,tmpDir);
  strcpy(datFileName,pcVar32);
  sVar16 = strlen(datFileName);
  builtin_strncpy(datFileName + sVar16,".dat",5);
  strcat((char *)&cmdBuf,datFileName);
  if (cVar31 != '\0') {
    fprintf(_stdout,"# Writing package file %s ..\n",&cmdBuf);
  }
  iVar9 = writePackageDatFile((char *)&cmdBuf,outComment,local_62a8,local_62e0->str,(Package *)0x0,
                              'l');
  if (iVar9 != 0) {
    main_cold_10();
    goto LAB_001e9a26;
  }
  if ((bVar26 & 0xfd) == 0x61) {
    memset(dirBuf,0,0x800);
    strcpy(dirBuf,targetDir);
    strcat(dirBuf,datFileName);
    iVar9 = strcmp((char *)&cmdBuf,dirBuf);
    if (iVar9 == 0) {
LAB_001e8a13:
      iVar9 = 0;
      if (installDir == (char *)0x0) goto LAB_001e9a26;
      iVar9 = 0;
      memset(&status_1,0,0x200);
      UVar6 = T_FileStream_file_exists(installDir);
      if (UVar6 == '\0') {
        newName[0] = '\0';
        newName[1] = '\0';
        newName[2] = '\0';
        newName[3] = '\0';
        uprv_mkdir(installDir,(UErrorCode *)newName);
        if (0 < (int)newName._0_4_) {
          pcVar32 = "Error creating installation directory: %s\n";
          pcVar22 = installDir;
          goto LAB_001e9d2b;
        }
      }
      UVar6 = 'd';
      sprintf((char *)&status_1,"%s %s %s",pkgDataFlags[0x10],dirBuf,installDir);
      iVar12 = runCommand((char *)&status_1,UVar6);
      if (iVar12 == 0) goto LAB_001e9a26;
      pcVar32 = "Failed to install data file with command: %s\n";
      pUVar27 = &status_1;
      iVar9 = iVar12;
    }
    else {
      UVar6 = T_FileStream_file_exists(dirBuf);
      if ((UVar6 == '\0') || (iVar9 = remove(dirBuf), iVar9 == 0)) {
        iVar9 = rename((char *)&cmdBuf,dirBuf);
        if (cVar31 != '\0') {
          fprintf(_stdout,"# Moving package file to %s ..\n",dirBuf);
        }
        if (iVar9 != 0) {
          fprintf(_stderr,"Unable to move dat file (%s) to target location (%s).\n",&cmdBuf,dirBuf);
          goto LAB_001e9a26;
        }
        goto LAB_001e8a13;
      }
      pcVar32 = "Unable to remove old dat file: %s\n";
      pUVar27 = (UErrorCode *)dirBuf;
    }
    fprintf(_stderr,pcVar32,pUVar27);
  }
  else {
    memset(gencFilePath,0,0x200);
    version_major[8] = '\0';
    version_major[9] = '\0';
    version_major[0] = '\0';
    version_major[1] = '\0';
    version_major[2] = '\0';
    version_major[3] = '\0';
    version_major[4] = '\0';
    version_major[5] = '\0';
    version_major[6] = '\0';
    version_major[7] = '\0';
    if (pcVar17 == (char *)0x0) {
      local_62e4 = '\x01';
      if ((bVar26 & 0xf7) == 100) {
        fwrite("Warning: Providing a revision number with the -r option is recommended when packaging data in the current mode.\n"
               ,0x70,1,_stdout);
      }
      pcVar35 = (char *)0x0;
    }
    else {
      lVar37 = 0;
      do {
        if (pcVar17[lVar37] == '.') {
          version_major[lVar37] = '\0';
          break;
        }
        version_major[lVar37] = pcVar17[lVar37];
        lVar37 = lVar37 + 1;
      } while (lVar37 != 10);
      local_62e4 = '\0';
    }
    ppcVar30 = pkgDataFlags;
    pcVar22 = pkgDataFlags[5];
    sVar16 = strlen(pcVar22);
    bVar2 = pcVar22[sVar16 - 1];
    local_62a0 = (CharList *)(ulong)bVar2;
    pcVar28 = ppcVar30[1];
    sVar16 = strlen(pcVar28);
    local_6302 = pcVar28[sVar16 - 1];
    if (pcVar35 == (char *)0x0) {
      pcVar35 = "";
    }
    pcVar18 = ".";
    if (*pcVar28 == '\0') {
      pcVar18 = "";
    }
    pcVar28 = "";
    if (*pcVar22 == '.') {
      pcVar28 = ".";
    }
    sprintf(libFileNames[0],"%s%s",ppcVar30[4],pcVar33);
    if (cVar31 != '\0') {
      fprintf(_stdout,"# libFileName[LIB_FILE] = %s\n",libFileNames);
    }
    pcVar22 = pkgDataFlags[2];
    if ((pcVar17 == (char *)0x0) && (bVar2 != local_6302)) {
      sprintf(libFileNames[3],"%s%s%s",libFileNames,pcVar28,pcVar22);
      sprintf(libFileNames[1],"%s%s%s",libFileNames,pcVar28,pkgDataFlags[1]);
      UVar6 = (UBool)pkgDataFlags[1];
      sprintf(libFileNames[2],"%s%s%s",libFileNames,pcVar28);
    }
    else {
      if (bVar2 == local_6302) {
        sprintf(libFileNames[3],"%s%s%s%s%s",libFileNames,pcVar28,pcVar35,pcVar18,pcVar22);
        sprintf(libFileNames[1],"%s%s%s%s%s",libFileNames,pcVar28,version_major,pcVar18,
                pkgDataFlags[1]);
        pcVar22 = pcVar35;
        pcVar35 = pkgDataFlags[1];
      }
      else {
        sprintf(libFileNames[3],"%s%s%s%s%s",libFileNames,pcVar28,pcVar22,pcVar18,pcVar35);
        sprintf(libFileNames[1],"%s%s%s%s%s",libFileNames,pcVar28,pkgDataFlags[1],pcVar18,
                version_major);
        pcVar22 = pkgDataFlags[1];
      }
      sprintf(libFileNames[2],"%s%s%s%s%s",libFileNames,pcVar28,pcVar22,pcVar18,pcVar35);
      UVar6 = (UBool)pcVar22;
    }
    if (cVar31 != '\0') {
      fprintf(_stdout,"# libFileName[LIB_FILE_VERSION] = %s\n",0x404d40);
    }
    if (bVar26 == 0x73) {
      sprintf(libFileNames[2],"%s.%s",libFileNames);
      libFileNames[1][0] = '\0';
      if (cVar31 != '\0') {
        fprintf(_stdout,"# libFileName[LIB_FILE_VERSION] = %s  (static)\n",0x404d40);
      }
      if (cVar4 != '\0') goto LAB_001e9114;
LAB_001e9012:
      sprintf(cmd,"%s%s",targetDir,0x404d40);
      UVar7 = T_FileStream_file_exists(cmd);
      if (UVar7 == '\0') {
        if (installDir != (char *)0x0 && cVar31 != '\0') {
          pcVar22 = "# Not installing missing %s into %s\n";
LAB_001e90f6:
          fprintf(_stdout,pcVar22,cmd);
        }
        goto LAB_001e9114;
      }
      UVar7 = isFileModTimeLater(cmd,local_62a8,'\x01');
      if ((UVar7 == '\0') || (UVar7 = isFileModTimeLater(cmd,local_62b0,'\0'), UVar7 == '\0')) {
        if (installDir != (char *)0x0 && cVar31 != '\0') {
          pcVar22 = "# Not installing up-to-date library %s into %s\n";
          goto LAB_001e90f6;
        }
        goto LAB_001e9114;
      }
      if (installDir != (char *)0x0) {
        if (cVar31 != '\0') {
          fprintf(_stdout,"# Installing already-built library into %s\n",installDir);
        }
LAB_001e96a8:
        iVar9 = pkg_installLibrary(installDir,targetDir,local_62e4);
        goto LAB_001e9a26;
      }
      if (cVar31 != '\0') {
        iVar9 = 0;
        printf("# Not rebuilding %s - up to date.\n",cmd);
        goto LAB_001e9a26;
      }
      goto LAB_001e9a23;
    }
    if (pcVar17 != (char *)0x0 && cVar4 == '\0') goto LAB_001e9012;
LAB_001e9114:
    local_62a0._0_1_ = bVar2;
    if ((cVar3 != '\0') || (pcVar22 = *pkgDataFlags, *pcVar22 == '\0')) {
      if (cVar31 != '\0') {
        fprintf(_stdout,"# Writing object code to %s ..\n",gencFilePath);
      }
      if (cVar3 == '\0') {
        local_6030 = local_6030 & 0xffff0000;
        _status_1 = (char *)0x0;
        pFVar23 = T_FileStream_open("oma.c","w");
        if (pFVar23 == (FileStream *)0x0) {
          main_cold_15();
          pUVar27 = (UErrorCode *)0x0;
        }
        else {
          T_FileStream_writeLine(pFVar23,"void oma(){}");
          T_FileStream_close(pFVar23);
          UVar6 = -3;
          sprintf(dirBuf,"%s %s -o %s",pkgDataFlags[6],"oma.c");
          iVar9 = runCommand(dirBuf,UVar6);
          if (iVar9 == 0) {
            _status_1 = (char *)0x6a626f2e616d6f;
          }
          else {
            main_cold_13();
          }
          UVar6 = T_FileStream_remove("oma.c");
          if (UVar6 == '\0') {
            main_cold_14();
          }
          pUVar27 = &status_1;
          if (iVar9 != 0) {
            pUVar27 = (UErrorCode *)0x0;
          }
        }
        UVar7 = '\0';
        writeObjectCode((char *)&cmdBuf,local_62b8,optEntryPoint,(char *)pUVar27,(char *)0x0,
                        gencFilePath);
        UVar6 = T_FileStream_file_exists((char *)&status_1);
        if ((UVar6 != '\0') && (UVar6 = T_FileStream_remove((char *)&status_1), UVar6 == '\0')) {
          fprintf(_stderr,"T_FileStream_remove failed to delete %s\n",&status_1);
        }
        iVar9 = pkg_generateLibraryFile(targetDir,bVar26,gencFilePath,(char *)0x0,UVar7);
      }
      else {
        uVar13 = pkg_countCharList(local_62c8);
        memset(dirBuf,0,0x200);
        memset(&status_1,0,0x200);
        if ((local_62c8 != (CharList *)0x0) && (local_6300 != (CharList *)0x0)) {
          pcVar22 = (char *)uprv_malloc_63((long)(int)(uVar13 * 0x200 + 0x400));
          if (pcVar22 == (char *)0x0) {
            main_cold_12();
          }
          else {
            local_62d8 = (char *)uprv_malloc_63((long)(int)(uVar13 * 0x200 + 0x200));
            if (local_62d8 != (char *)0x0) {
              if (-1 < (int)uVar13) {
                local_6280 = local_62c8;
                local_6290 = local_6300;
                uVar14 = 0;
LAB_001e922e:
                if (uVar14 != 0) {
                  pcVar35 = local_6280->str;
                  pcVar33 = local_6290->str;
                  dataName[0] = '\0';
                  newName._0_4_ = newName._0_4_ & 0xffffff00;
                  uVar34 = 0;
LAB_001e926c:
                  status = status & 0xffffff00;
                  pacVar1 = DATA_PREFIX + uVar34;
                  sprintf((char *)&status,"%s%s",pacVar1);
                  pcVar28 = strstr(pcVar33,(char *)&status);
                  if (pcVar28 != (char *)0x0) {
                    memset(local_4c38,0,0x200);
                    sVar16 = strlen((char *)&status);
                    lVar37 = 0;
                    do {
                      if (pcVar33[lVar37 + sVar16] == '.') {
                        local_4c38[lVar37] = '_';
                      }
                      else {
                        local_4c38[lVar37] = pcVar33[lVar37 + sVar16];
                        if (pcVar33[lVar37 + sVar16] == '\0') goto LAB_001e92f3;
                      }
                      lVar37 = lVar37 + 1;
                    } while( true );
                  }
                  goto LAB_001e932a;
                }
                createCommonDataFile
                          (local_62b8,pcVar32,optEntryPoint,(char *)0x0,local_62a8,outComment,
                           local_62e0->str,0,'\x01',cVar31,dirBuf);
                *local_62d8 = '\0';
                goto LAB_001e93f6;
              }
LAB_001e94a4:
              iVar9 = pkg_generateLibraryFile(targetDir,bVar26,local_62d8,pcVar22,UVar6);
              local_62f8._0_1_ = bVar26;
              goto LAB_001e94c7;
            }
            main_cold_11();
          }
        }
        iVar9 = -1;
      }
      goto LAB_001e9802;
    }
    if (cVar31 != '\0') {
      fprintf(_stdout,"# Generating assembly code %s of type %s ..\n",gencFilePath);
    }
    sVar16 = strlen(pcVar22);
    if ((3 < sVar16) && (UVar6 = checkAssemblyHeaderName(pcVar22 + 3), UVar6 != '\0')) {
      writeAssemblyCode((char *)&cmdBuf,local_62b8,optEntryPoint,(char *)0x0,gencFilePath);
      memset(dirBuf,0,0x200);
      strcpy(dirBuf,gencFilePath);
      sVar16 = strlen(dirBuf);
      ppcVar30 = pkgDataFlags;
      dirBuf[sVar16 - 1] = 'o';
      sVar16 = strlen(pkgDataFlags[6]);
      sVar21 = strlen(ppcVar30[7]);
      sVar24 = strlen(dirBuf);
      sVar25 = strlen(gencFilePath);
      pcVar32 = (char *)uprv_malloc_63((long)((int)sVar25 + (int)sVar24 + (int)sVar21 + (int)sVar16
                                             + 0x14));
      if (pcVar32 == (char *)0x0) {
        iVar9 = -1;
      }
      else {
        UVar6 = -9;
        pcVar22 = dirBuf;
        sprintf(pcVar32,"%s %s -o %s %s",pkgDataFlags[6],pkgDataFlags[7],pcVar22,gencFilePath);
        UVar7 = (UBool)pcVar22;
        iVar9 = runCommand(pcVar32,UVar6);
        uprv_free_63(pcVar32);
        if (iVar9 == 0) {
          iVar9 = pkg_generateLibraryFile(targetDir,bVar26,dirBuf,(char *)0x0,UVar7);
          if (iVar9 == 0) {
            if (bVar26 == 0x73) {
              if (installDir != (char *)0x0) {
                if (cVar31 != '\0') {
                  fprintf(_stdout,"# Installing static library into %s\n",installDir);
                }
                goto LAB_001e96a8;
              }
              goto LAB_001e9a23;
            }
            goto LAB_001e9814;
          }
        }
        else {
          fprintf(_stderr,"Error creating with assembly code. Failed command: %s\n",pcVar32);
        }
      }
      pcVar32 = "Error generating assembly code for data.\n";
      sVar16 = 0x29;
      goto LAB_001e9d99;
    }
    pcVar32 = "Assembly type \"%s\" is unknown.\n";
LAB_001e9d2b:
    fprintf(_stderr,pcVar32,pcVar22);
    iVar9 = -1;
  }
LAB_001e9a26:
  if (pkgDataFlags != (char **)0x0) {
    lVar37 = 0;
    ppcVar30 = pkgDataFlags;
    do {
      if (ppcVar30[lVar37] != (char *)0x0) {
        uprv_free_63(ppcVar30[lVar37]);
        ppcVar30 = pkgDataFlags;
      }
      lVar37 = lVar37 + 1;
    } while (lVar37 != 0x11);
    uprv_free_63(ppcVar30);
  }
  if (buffer != (char *)0x0) {
    uprv_free_63(buffer);
  }
  if (!bVar38) {
    pkg_deleteList(local_62e0);
  }
  if (local_62c8 != (CharList *)0x0) {
    pkg_deleteList(local_62c8);
  }
  if (local_6300 != (CharList *)0x0) {
    pkg_deleteList(local_6300);
    return iVar9;
  }
  return iVar9;
LAB_001e92f3:
  sprintf(newName,"%s_%s",pacVar1,local_4c38);
  sprintf(dataName,"%s_%s",pcVar32,pacVar1);
LAB_001e932a:
  if ((7 < uVar34) || (uVar34 = uVar34 + 1, newName[0] != '\0')) goto LAB_001e9342;
  goto LAB_001e926c;
LAB_001e9342:
  if (cVar31 != '\0') {
    printf("# Generating %s \n",dirBuf);
  }
  pcVar33 = dataName;
  if (dataName[0] == '\0') {
    pcVar33 = pcVar32;
  }
  pcVar28 = newName;
  if (newName[0] == '\0') {
    pcVar28 = (char *)0x0;
  }
  writeCCode(pcVar35,local_62b8,pcVar33,pcVar28,dirBuf);
LAB_001e93f6:
  strcpy((char *)&status_1,dirBuf);
  sVar16 = strlen((char *)&status_1);
  *(char *)((sVar16 - 1) + (long)&status_1) = 'o';
  UVar7 = -9;
  pUVar27 = &status_1;
  sprintf(pcVar22,"%s %s -o %s %s",pkgDataFlags[6],pkgDataFlags[7],&status_1,dirBuf);
  UVar6 = (UBool)pUVar27;
  iVar9 = runCommand(pcVar22,UVar7);
  if (iVar9 != 0) goto LAB_001e9dd5;
  sVar16 = strlen(local_62d8);
  (local_62d8 + sVar16)[0] = ' ';
  (local_62d8 + sVar16)[1] = '\0';
  strcat(local_62d8,(char *)&status_1);
  if (uVar14 != 0) {
    local_6280 = local_6280->next;
    local_6290 = local_6290->next;
  }
  bVar39 = uVar14 == uVar13;
  uVar14 = uVar14 + 1;
  if (bVar39) goto LAB_001e94a4;
  goto LAB_001e922e;
LAB_001e9dd5:
  fprintf(_stderr,"Error creating library without assembly code. Failed command: %s\n",pcVar22);
LAB_001e94c7:
  uprv_free_63(local_62d8);
  uprv_free_63(pcVar22);
  bVar26 = (byte)local_62f8;
LAB_001e9802:
  if (iVar9 != 0) {
    main_cold_16();
    goto LAB_001e9a26;
  }
  if (bVar26 != 0x73) {
LAB_001e9814:
    if (cVar31 != '\0') {
      fwrite("# Creating data archive library file ..\n",0x28,1,_stdout);
    }
    ppcVar30 = pkgDataFlags;
    pcVar32 = pkgDataFlags[1];
    iVar9 = strcmp(pkgDataFlags[2],pcVar32);
    if ((iVar9 != 0) && (iVar9 = strcmp(ppcVar30[3],pcVar32), iVar9 == 0)) {
      pcVar22 = "";
      if (*ppcVar30[5] == '.') {
        pcVar22 = ".";
      }
      pcVar33 = pcVar32;
      pcVar35 = pcVar17;
      if ((byte)local_62a0 != local_6302) {
        pcVar33 = pcVar17;
        pcVar35 = pcVar32;
      }
      sprintf(libFileNames[2],"%s%s%s.%s",libFileNames,pcVar22,pcVar35,pcVar33);
      UVar6 = '\b';
      sprintf(dirBuf,"%s %s %s%s %s%s",pkgDataFlags[0xd],pkgDataFlags[0xe],targetDir,0x404d40,
              targetDir,0x404e40);
      iVar9 = runCommand(dirBuf,UVar6);
      if (iVar9 == 0) {
        UVar6 = '\x10';
        sprintf(dirBuf,"%s %s%s",pkgDataFlags[0xf],targetDir,0x404d40);
        iVar9 = runCommand(dirBuf,UVar6);
        if (iVar9 == 0) {
          UVar6 = '\x10';
          sprintf(dirBuf,"%s %s%s","rm -f",targetDir,0x404e40);
          iVar9 = runCommand(dirBuf,UVar6);
          if (iVar9 == 0) goto LAB_001e99b5;
        }
      }
      fprintf(_stderr,"Error creating archive library. Failed command: %s\n",dirBuf);
      pcVar32 = "Error creating data archive library file.\n";
      sVar16 = 0x2a;
LAB_001e9d99:
      fwrite(pcVar32,sVar16,1,_stderr);
      goto LAB_001e9a26;
    }
    UVar6 = '@';
    strcpy(libFileNames[2],libFileNames[3]);
LAB_001e99b5:
    if ((pcVar17 != (char *)0x0) && (iVar9 = pkg_createSymLinks(targetDir,UVar6), iVar9 != 0)) {
      main_cold_17();
      goto LAB_001e9a26;
    }
  }
  if (installDir != (char *)0x0) {
    if (cVar31 != '\0') {
      fprintf(_stdout,"# Installing library file to %s ..\n",installDir);
    }
    iVar9 = pkg_installLibrary(installDir,targetDir,local_62e4);
    if (iVar9 != 0) {
      main_cold_18();
      goto LAB_001e9a26;
    }
  }
LAB_001e9a23:
  iVar9 = 0;
  goto LAB_001e9a26;
}

Assistant:

int
main(int argc, char* argv[]) {
    int result = 0;
    /* FileStream  *out; */
    UPKGOptions  o;
    CharList    *tail;
    UBool        needsHelp = FALSE;
    UErrorCode   status = U_ZERO_ERROR;
    /* char         tmp[1024]; */
    uint32_t i;
    int32_t n;

    U_MAIN_INIT_ARGS(argc, argv);

    progname = argv[0];

    options[MODE].value = "common";

    /* read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    /* I've decided to simply print an error and quit. This tool has too
    many options to just display them all of the time. */

    if(options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        needsHelp = TRUE;
    }
    else {
        if(!needsHelp && argc<0) {
            fprintf(stderr,
                "%s: error in command line argument \"%s\"\n",
                progname,
                argv[-argc]);
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
        if(!options[BLDOPT].doesOccur && uprv_strcmp(options[MODE].value, "common") != 0) {
          if (pkg_getOptionsFromICUConfig(options[VERBOSE].doesOccur, &options[BLDOPT]) != 0) {
                fprintf(stderr, " required parameter is missing: -O is required for static and shared builds.\n");
                fprintf(stderr, "Run '%s --help' for help.\n", progname);
                return 1;
            }
        }
#else
        if(options[BLDOPT].doesOccur) {
            fprintf(stdout, "Warning: You are using the -O option which is not needed for MSVC build on Windows.\n");
        }
#endif

        if(!options[NAME].doesOccur) /* -O we already have - don't report it. */
        {
            fprintf(stderr, " required parameter -p is missing \n");
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }

        if(argc == 1) {
            fprintf(stderr,
                "No input files specified.\n"
                "Run '%s --help' for help.\n", progname);
            return 1;
        }
    }   /* end !needsHelp */

    if(argc<0 || needsHelp  ) {
        fprintf(stderr,
            "usage: %s [-options] [-] [packageFile] \n"
            "\tProduce packaged ICU data from the given list(s) of files.\n"
            "\t'-' by itself means to read from stdin.\n"
            "\tpackageFile is a text file containing the list of files to package.\n",
            progname);

        fprintf(stderr, "\n options:\n");
        for(i=0;i<UPRV_LENGTHOF(options);i++) {
            fprintf(stderr, "%-5s -%c %s%-10s  %s\n",
                (i<1?"[REQ]":""),
                options[i].shortName,
                options[i].longName ? "or --" : "     ",
                options[i].longName ? options[i].longName : "",
                options_help[i]);
        }

        fprintf(stderr, "modes: (-m option)\n");
        for(i=0;i<UPRV_LENGTHOF(modes);i++) {
            fprintf(stderr, "   %-9s ", modes[i].name);
            if (modes[i].alt_name) {
                fprintf(stderr, "/ %-9s", modes[i].alt_name);
            } else {
                fprintf(stderr, "           ");
            }
            fprintf(stderr, "  %s\n", modes[i].desc);
        }
        return 1;
    }

    /* OK, fill in the options struct */
    uprv_memset(&o, 0, sizeof(o));

    o.mode      = options[MODE].value;
    o.version   = options[REVISION].doesOccur ? options[REVISION].value : 0;

    o.shortName = options[NAME].value;
    {
        int32_t len = (int32_t)uprv_strlen(o.shortName);
        char *csname, *cp;
        const char *sp;

        cp = csname = (char *) uprv_malloc((len + 1 + 1) * sizeof(*o.cShortName));
        if (*(sp = o.shortName)) {
            *cp++ = isalpha(*sp) ? * sp : '_';
            for (++sp; *sp; ++sp) {
                *cp++ = isalnum(*sp) ? *sp : '_';
            }
        }
        *cp = 0;

        o.cShortName = csname;
    }

    if(options[LIBNAME].doesOccur) { /* get libname from shortname, or explicit -L parameter */
      o.libName = options[LIBNAME].value;
    } else {
      o.libName = o.shortName;
    }

    if(options[QUIET].doesOccur) {
      o.quiet = TRUE;
    } else {
      o.quiet = FALSE;
    }

    if(options[PDS_BUILD].doesOccur) {
#if U_PLATFORM == U_PF_OS390
      o.pdsbuild = TRUE;
#else
      o.pdsbuild = FALSE;
      fprintf(stdout, "Warning: You are using the -z option which only works on z/OS.\n");

#endif
    } else {
      o.pdsbuild = FALSE;
    }

    o.verbose   = options[VERBOSE].doesOccur;


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN) /* on UNIX, we'll just include the file... */
    if (options[BLDOPT].doesOccur) {
        o.options   = options[BLDOPT].value;
    } else {
        o.options = NULL;
    }
#endif
    if(options[COPYRIGHT].doesOccur) {
        o.comment = U_COPYRIGHT_STRING;
    } else if (options[COMMENT].doesOccur) {
        o.comment = options[COMMENT].value;
    }

    if( options[DESTDIR].doesOccur ) {
        o.targetDir = options[DESTDIR].value;
    } else {
        o.targetDir = ".";  /* cwd */
    }

    o.rebuild   = options[REBUILD].doesOccur;

    if( options[TEMPDIR].doesOccur ) {
        o.tmpDir    = options[TEMPDIR].value;
    } else {
        o.tmpDir    = o.targetDir;
    }

    if( options[INSTALL].doesOccur ) {
        o.install  = options[INSTALL].value;
    } else {
        o.install = NULL;
    }

    if( options[SOURCEDIR].doesOccur ) {
        o.srcDir   = options[SOURCEDIR].value;
    } else {
        o.srcDir   = ".";
    }

    if( options[ENTRYPOINT].doesOccur ) {
        o.entryName = options[ENTRYPOINT].value;
    } else {
        o.entryName = o.cShortName;
    }

    o.withoutAssembly = FALSE;
    if (options[WITHOUT_ASSEMBLY].doesOccur) {
#ifndef BUILD_DATA_WITHOUT_ASSEMBLY
        fprintf(stdout, "Warning: You are using the option to build without assembly code which is not supported on this platform.\n");
        fprintf(stdout, "Warning: This option will be ignored.\n");
#else
        o.withoutAssembly = TRUE;
#endif
    }

    /* OK options are set up. Now the file lists. */
    tail = NULL;
    for( n=1; n<argc; n++) {
        o.fileListFiles = pkg_appendToList(o.fileListFiles, &tail, uprv_strdup(argv[n]));
    }

    /* load the files */
    loadLists(&o, &status);
    if( U_FAILURE(status) ) {
        fprintf(stderr, "error loading input file lists: %s\n", u_errorName(status));
        return 2;
    }

    result = pkg_executeOptions(&o);

    if (pkgDataFlags != NULL) {
        for (n = 0; n < PKGDATA_FLAGS_SIZE; n++) {
            if (pkgDataFlags[n] != NULL) {
                uprv_free(pkgDataFlags[n]);
            }
        }
        uprv_free(pkgDataFlags);
    }

    if (o.cShortName != NULL) {
        uprv_free((char *)o.cShortName);
    }
    if (o.fileListFiles != NULL) {
        pkg_deleteList(o.fileListFiles);
    }
    if (o.filePaths != NULL) {
        pkg_deleteList(o.filePaths);
    }
    if (o.files != NULL) {
        pkg_deleteList(o.files);
    }

    return result;
}